

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O2

int ecx_send_processdata_group(ecx_contextt *context,uint8 group)

{
  ec_idxstackT *peVar1;
  uint uVar2;
  int iVar3;
  uint32 uVar4;
  uint8 uVar5;
  ulong uVar6;
  uint32 uVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  ec_groupt *peVar9;
  int iVar10;
  uint uVar11;
  uint16 uVar12;
  uint8 *puVar13;
  void *data;
  uint32 uVar14;
  bool bVar15;
  uint16 length;
  
  peVar9 = context->grouplist;
  uVar6 = CONCAT71(in_register_00000031,group) & 0xffffffff;
  bVar15 = peVar9[uVar6].hasdc == '\0';
  uVar7 = peVar9[uVar6].Obytes;
  uVar4 = peVar9[uVar6].Ibytes;
  iVar10 = uVar4 + uVar7;
  if (iVar10 == 0) {
    iVar10 = 0;
  }
  else {
    uVar14 = peVar9[uVar6].logstartaddr;
    if (group == '\0') {
      peVar1 = context->idxstack;
      peVar1->pushed = '\0';
      peVar1->pulled = '\0';
    }
    if (peVar9[uVar6].blockLRW == '\0') {
      data = *(void **)(peVar9[uVar6].IOsegment + (ulong)(uVar7 == 0) * 4 + -0xb);
      uVar8 = 0;
      do {
        uVar7 = peVar9[uVar6].IOsegment[uVar8];
        uVar2 = ecx_getindex(context->port);
        uVar11 = uVar2 & 0xff;
        uVar12 = (uint16)uVar7;
        uVar5 = (uint8)uVar2;
        ecx_setupdatagram(context->port,context->port->txbuf + uVar11,'\f',uVar5,(uint16)uVar14,
                          (uint16)(uVar14 >> 0x10),uVar12,data);
        if (!bVar15) {
          context->DCl = uVar12;
          iVar3 = ecx_adddatagram(context->port,context->port->txbuf + uVar11,'\x0e',uVar5,'\0',
                                  context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                  0x910,8,context->DCtime);
          context->DCtO = (uint16)iVar3;
        }
        ecx_outframe_red(context->port,uVar11);
        ecx_pushindex(context,uVar5,data,uVar12);
        iVar10 = iVar10 - uVar7;
        if (iVar10 == 0) break;
        uVar8 = uVar8 + 1;
        data = (void *)((long)data + (long)(int)uVar7);
        uVar14 = uVar14 + uVar7;
        peVar9 = context->grouplist;
        bVar15 = true;
      } while (uVar8 < peVar9[uVar6].nsegments);
    }
    else {
      if (uVar4 != 0) {
        uVar12 = peVar9[uVar6].Isegment;
        puVar13 = peVar9[uVar6].inputs;
        iVar10 = uVar14 + uVar7;
        do {
          uVar7 = peVar9[uVar6].IOsegment[uVar12];
          if (uVar12 == peVar9[uVar6].Isegment) {
            uVar7 = uVar7 - peVar9[uVar6].Ioffset;
          }
          uVar2 = ecx_getindex(context->port);
          uVar11 = uVar2 & 0xff;
          length = (uint16)uVar7;
          uVar5 = (uint8)uVar2;
          ecx_setupdatagram(context->port,context->port->txbuf + uVar11,'\n',uVar5,(uint16)iVar10,
                            (uint16)((uint)iVar10 >> 0x10),length,puVar13);
          if (!bVar15) {
            context->DCl = length;
            iVar3 = ecx_adddatagram(context->port,context->port->txbuf + uVar11,'\x0e',uVar5,'\0',
                                    context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                    0x910,8,context->DCtime);
            context->DCtO = (uint16)iVar3;
          }
          ecx_outframe_red(context->port,uVar11);
          ecx_pushindex(context,uVar5,puVar13,length);
          peVar9 = context->grouplist;
          uVar4 = uVar4 - uVar7;
          if (uVar4 == 0) break;
          uVar12 = uVar12 + 1;
          puVar13 = puVar13 + (int)uVar7;
          iVar10 = iVar10 + uVar7;
          bVar15 = true;
        } while (uVar12 < peVar9[uVar6].nsegments);
        uVar7 = peVar9[uVar6].Obytes;
        bVar15 = true;
      }
      if (uVar7 == 0) {
        return 1;
      }
      puVar13 = peVar9[uVar6].outputs;
      uVar4 = peVar9[uVar6].logstartaddr;
      uVar8 = 0;
      do {
        uVar14 = peVar9[uVar6].IOsegment[uVar8];
        if ((int)uVar7 < (int)peVar9[uVar6].IOsegment[uVar8]) {
          uVar14 = uVar7;
        }
        uVar2 = ecx_getindex(context->port);
        uVar11 = uVar2 & 0xff;
        uVar12 = (uint16)uVar14;
        uVar5 = (uint8)uVar2;
        ecx_setupdatagram(context->port,context->port->txbuf + uVar11,'\v',uVar5,(uint16)uVar4,
                          (uint16)(uVar4 >> 0x10),uVar12,puVar13);
        if (!bVar15) {
          context->DCl = uVar12;
          iVar10 = ecx_adddatagram(context->port,context->port->txbuf + uVar11,'\x0e',uVar5,'\0',
                                   context->slavelist[context->grouplist[uVar6].DCnext].configadr,
                                   0x910,8,context->DCtime);
          context->DCtO = (uint16)iVar10;
        }
        ecx_outframe_red(context->port,uVar11);
        ecx_pushindex(context,uVar5,puVar13,uVar12);
        uVar7 = uVar7 - uVar14;
        if (uVar7 == 0) break;
        uVar8 = uVar8 + 1;
        puVar13 = puVar13 + (int)uVar14;
        uVar4 = uVar4 + uVar14;
        peVar9 = context->grouplist;
        bVar15 = true;
      } while (uVar8 < peVar9[uVar6].nsegments);
    }
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int ecx_send_processdata_group(ecx_contextt *context, uint8 group)
{
   uint32 LogAdr;
   uint16 w1, w2;
   int length, sublength;
   uint8 idx;
   int wkc;
   uint8* data;
   boolean first=FALSE;
   uint16 currentsegment = 0;

   wkc = 0;
   if(context->grouplist[group].hasdc)
   {
      first = TRUE;
   }
   length = context->grouplist[group].Obytes + context->grouplist[group].Ibytes;
   LogAdr = context->grouplist[group].logstartaddr;
   if (length)
   {
      if(!group)
      {
         context->idxstack->pushed = 0;
         context->idxstack->pulled = 0;
      }
      wkc = 1;
      /* LRW blocked by one or more slaves ? */
      if (context->grouplist[group].blockLRW)
      {
         /* if inputs available generate LRD */
         if(context->grouplist[group].Ibytes)
         {
            currentsegment = context->grouplist[group].Isegment;
            data = context->grouplist[group].inputs;
            length = context->grouplist[group].Ibytes;
            LogAdr += context->grouplist[group].Obytes;
            /* segment transfer if needed */
            do
            {
               if(currentsegment == context->grouplist[group].Isegment)
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++] - context->grouplist[group].Ioffset;
               }
               else
               {
                  sublength = context->grouplist[group].IOsegment[currentsegment++];
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRD, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
         /* if outputs available generate LWR */
         if(context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
            length = context->grouplist[group].Obytes;
            LogAdr = context->grouplist[group].logstartaddr;
            currentsegment = 0;
            /* segment transfer if needed */
            do
            {
               sublength = context->grouplist[group].IOsegment[currentsegment++];
               if((length - sublength) < 0)
               {
                  sublength = length;
               }
               /* get new index */
               idx = ecx_getindex(context->port);
               w1 = LO_WORD(LogAdr);
               w2 = HI_WORD(LogAdr);
               ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LWR, idx, w1, w2, sublength, data);
               if(first)
               {
                  context->DCl = sublength;
                  /* FPRMW in second datagram */
                  context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                           context->slavelist[context->grouplist[group].DCnext].configadr,
                                           ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
                  first = FALSE;
               }
               /* send frame */
               ecx_outframe_red(context->port, idx);
               /* push index and data pointer on stack */
               ecx_pushindex(context, idx, data, sublength);
               length -= sublength;
               LogAdr += sublength;
               data += sublength;
            } while (length && (currentsegment < context->grouplist[group].nsegments));
         }
      }
      /* LRW can be used */
      else
      {
         if (context->grouplist[group].Obytes)
         {
            data = context->grouplist[group].outputs;
         }
         else
         {
            data = context->grouplist[group].inputs;
         }
         /* segment transfer if needed */
         do
         {
            sublength = context->grouplist[group].IOsegment[currentsegment++];
            /* get new index */
            idx = ecx_getindex(context->port);
            w1 = LO_WORD(LogAdr);
            w2 = HI_WORD(LogAdr);
            ecx_setupdatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_LRW, idx, w1, w2, sublength, data);
            if(first)
            {
               context->DCl = sublength;
               /* FPRMW in second datagram */
               context->DCtO = ecx_adddatagram(context->port, &(context->port->txbuf[idx]), EC_CMD_FRMW, idx, FALSE,
                                        context->slavelist[context->grouplist[group].DCnext].configadr,
                                        ECT_REG_DCSYSTIME, sizeof(context->DCtime), context->DCtime);
               first = FALSE;
            }
            /* send frame */
            ecx_outframe_red(context->port, idx);
            /* push index and data pointer on stack */
            ecx_pushindex(context, idx, data, sublength);
            length -= sublength;
            LogAdr += sublength;
            data += sublength;
         } while (length && (currentsegment < context->grouplist[group].nsegments));
      }
   }

   return wkc;
}